

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pedersen_impl.h
# Opt level: O0

void secp256k1_pedersen_ecmult
               (secp256k1_gej *rj,secp256k1_scalar *sec,uint64_t value,secp256k1_ge *value_gen,
               secp256k1_ge *blind_gen)

{
  int iVar1;
  uint64_t in_RDX;
  secp256k1_ge bp;
  secp256k1_gej bj;
  secp256k1_scalar vs;
  int in_stack_0000054c;
  secp256k1_scalar *in_stack_00000550;
  secp256k1_ge *in_stack_00000558;
  secp256k1_gej *in_stack_00000560;
  secp256k1_gej *in_stack_ffffffffffffff28;
  secp256k1_ge *in_stack_ffffffffffffff30;
  secp256k1_gej local_c8;
  secp256k1_scalar local_48 [2];
  
  secp256k1_scalar_set_u64(local_48,in_RDX);
  secp256k1_ecmult_const(in_stack_00000560,in_stack_00000558,in_stack_00000550,in_stack_0000054c);
  secp256k1_ecmult_const(in_stack_00000560,in_stack_00000558,in_stack_00000550,in_stack_0000054c);
  iVar1 = secp256k1_gej_is_infinity(&local_c8);
  if (iVar1 == 0) {
    secp256k1_ge_set_gej(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    secp256k1_gej_add_ge
              ((secp256k1_gej *)blind_gen,(secp256k1_gej *)vs.d[3],(secp256k1_ge *)vs.d[2]);
  }
  secp256k1_gej_clear((secp256k1_gej *)0x10b777);
  secp256k1_ge_clear((secp256k1_ge *)0x10b781);
  secp256k1_scalar_clear(local_48);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_pedersen_ecmult(secp256k1_gej *rj, const secp256k1_scalar *sec, uint64_t value, const secp256k1_ge* value_gen, const secp256k1_ge* blind_gen) {
    secp256k1_scalar vs;
    secp256k1_gej bj;
    secp256k1_ge bp;

    secp256k1_scalar_set_u64(&vs, value);
    secp256k1_ecmult_const(rj, value_gen, &vs, 64);
    secp256k1_ecmult_const(&bj, blind_gen, sec, 256);

    /* zero blinding factor indicates that we are not trying to be zero-knowledge,
     * so not being constant-time in this case is OK. */
    if (!secp256k1_gej_is_infinity(&bj)) {
        secp256k1_ge_set_gej(&bp, &bj);
        secp256k1_gej_add_ge(rj, rj, &bp);
    }

    secp256k1_gej_clear(&bj);
    secp256k1_ge_clear(&bp);
    secp256k1_scalar_clear(&vs);
}